

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::AddJoin(Clipper *this,OutPt *op1,OutPt *op2,IntPoint OffPt)

{
  Join *this_00;
  Join *local_38;
  Join *j;
  OutPt *op2_local;
  OutPt *op1_local;
  Clipper *this_local;
  IntPoint OffPt_local;
  
  OffPt_local.X = OffPt.Y;
  this_local = (Clipper *)OffPt.X;
  j = (Join *)op2;
  op2_local = op1;
  op1_local = (OutPt *)this;
  this_00 = (Join *)operator_new(0x20);
  Join::Join(this_00);
  this_00->OutPt1 = op2_local;
  this_00->OutPt2 = (OutPt *)j;
  (this_00->OffPt).X = (cInt)this_local;
  (this_00->OffPt).Y = OffPt_local.X;
  local_38 = this_00;
  std::vector<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>::push_back
            (&this->m_Joins,&local_38);
  return;
}

Assistant:

void Clipper::AddJoin(OutPt *op1, OutPt *op2, const IntPoint OffPt)
{
  Join* j = new Join;
  j->OutPt1 = op1;
  j->OutPt2 = op2;
  j->OffPt = OffPt;
  m_Joins.push_back(j);
}